

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void build_node(XML_Parser parser,int src_node,XML_Content *dest,XML_Content **contpos,char **strpos
               )

{
  char cVar1;
  char *pcVar2;
  int local_40;
  uint local_3c;
  int cn;
  uint i;
  char *src;
  char **strpos_local;
  XML_Content **contpos_local;
  XML_Content *dest_local;
  int src_node_local;
  XML_Parser parser_local;
  
  dest->type = *(XML_Content_Type *)(*(long *)((long)parser + 0x3a8) + (long)src_node * 0x20);
  dest->quant = *(XML_Content_Quant *)(*(long *)((long)parser + 0x3a8) + (long)src_node * 0x20 + 4);
  if (dest->type == XML_CTYPE_NAME) {
    dest->name = *strpos;
    _cn = *(char **)(*(long *)((long)parser + 0x3a8) + (long)src_node * 0x20 + 8);
    while( true ) {
      cVar1 = *_cn;
      pcVar2 = *strpos;
      *strpos = pcVar2 + 1;
      *pcVar2 = cVar1;
      if (*_cn == '\0') break;
      _cn = _cn + 1;
    }
    dest->numchildren = 0;
    dest->children = (XML_Content *)0x0;
  }
  else {
    dest->numchildren = *(uint *)(*(long *)((long)parser + 0x3a8) + (long)src_node * 0x20 + 0x18);
    dest->children = *contpos;
    *contpos = *contpos + dest->numchildren;
    local_3c = 0;
    local_40 = *(int *)(*(long *)((long)parser + 0x3a8) + (long)src_node * 0x20 + 0x10);
    for (; local_3c < dest->numchildren; local_3c = local_3c + 1) {
      build_node(parser,local_40,dest->children + local_3c,contpos,strpos);
      local_40 = *(int *)(*(long *)((long)parser + 0x3a8) + (long)local_40 * 0x20 + 0x1c);
    }
    dest->name = (XML_Char *)0x0;
  }
  return;
}

Assistant:

static void
build_node (XML_Parser parser,
            int src_node,
            XML_Content *dest,
            XML_Content **contpos,
            char **strpos)
{
  dest->type = dtd.scaffold[src_node].type;
  dest->quant = dtd.scaffold[src_node].quant;
  if (dest->type == XML_CTYPE_NAME) {
    const char *src;
    dest->name = *strpos;
    src = dtd.scaffold[src_node].name;
    for (;;) {
      *(*strpos)++ = *src;
      if (! *src)
        break;
      src++;
    }
    dest->numchildren = 0;
    dest->children = 0;
  }
  else {
    unsigned int i;
    int cn;
    dest->numchildren = dtd.scaffold[src_node].childcnt;
    dest->children = *contpos;
    *contpos += dest->numchildren;
    for (i = 0, cn = dtd.scaffold[src_node].firstchild;
         i < dest->numchildren;
         i++, cn = dtd.scaffold[cn].nextsib) {
      build_node(parser, cn, &(dest->children[i]), contpos, strpos);
    }
    dest->name = 0;
  }
}